

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O1

void __thiscall
pzgeom::TPZNodeRep<4,_pztopology::TPZTetrahedron>::Initialize
          (TPZNodeRep<4,_pztopology::TPZTetrahedron> *this,TPZVec<long> *nodeindexes)

{
  long lVar1;
  ostream *this_00;
  size_t sVar2;
  long lVar3;
  stringstream sout;
  long *local_1d0;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  lVar1 = nodeindexes->fNElements;
  lVar3 = 4;
  if (lVar1 < 4) {
    lVar3 = lVar1;
  }
  if (lVar1 == 4) {
    memcpy(this->fNodeIndexes,nodeindexes->fStore,lVar3 * 8);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,
             "void pzgeom::TPZNodeRep<4, pztopology::TPZTetrahedron>::Initialize(TPZVec<int64_t> &) [N = 4, Topology = pztopology::TPZTetrahedron]"
             ,0x84);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0," Nodeindexes have wrong size ",0x1d)
  ;
  this_00 = std::ostream::_M_insert<long>((long)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," but should be ",0xf);
  std::ostream::operator<<(this_00,4);
  std::__cxx11::stringbuf::str();
  if (local_1d0 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a5d2a8);
  }
  else {
    sVar2 = strlen((char *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_1d0,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pznoderep.h",
             0x71);
}

Assistant:

void Initialize(TPZVec<int64_t> &nodeindexes)
        {
            int64_t nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifndef PZNODEBUG
            if(nodeindexes.NElements() != N)
            {
                std::stringstream sout;
                sout << __PRETTY_FUNCTION__ << " Nodeindexes have wrong size " << nodeindexes.NElements() << " but should be " << N;
                std::cout << sout.str().c_str() << std::endl;
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int64_t i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
            
        }